

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall embree::XMLWriter::store_parm(XMLWriter *this,char *name,float *v)

{
  size_t sVar1;
  ostream *poVar2;
  undefined1 *puVar3;
  ulong uVar4;
  
  if (this->ident != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->ident);
  }
  puVar3 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,"<float name=\"",0xd);
  if (name == (char *)0x0) {
    std::ios::clear((int)puVar3 + (int)*(undefined8 *)(*(long *)puVar3 + -0x18));
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,"\">",2);
  poVar2 = std::ostream::_M_insert<double>((double)*v);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</float>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store_parm(const char* name, const float& v) {
    tab(); xml << "<float name=\"" << name << "\">" << v << "</float>" << std::endl;
  }